

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_wrapper.hpp
# Opt level: O3

string * pico_tree::internal::open_stream(string *filename,openmode mode)

{
  char cVar1;
  runtime_error *this;
  _Ios_Openmode in_EDX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::fstream::fstream(filename,(string *)CONCAT44(in_register_00000034,mode),in_EDX);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    return filename;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"unable to open file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000034,mode));
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::fstream open_stream(
    std::string const& filename, std::ios_base::openmode mode) {
  std::fstream stream(filename, mode);

  if (!stream.is_open()) {
    throw std::runtime_error("unable to open file: " + filename);
  }

  return stream;
}